

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

int * immutable::transient_rrb_nth<int,false,6>
                (ref<immutable::transient_rrb<int,_false,_6>_> *trrb,uint32_t index)

{
  int *piVar1;
  ref<immutable::rrb<int,_false,_6>_> local_18;
  
  rrb_details::check_transience<int,false,6>(trrb);
  local_18.ptr = (rrb<int,_false,_6> *)trrb->ptr;
  if ((transient_rrb<int,_false,_6> *)local_18.ptr != (transient_rrb<int,_false,_6> *)0x0) {
    ((transient_rrb<int,_false,_6> *)local_18.ptr)->_ref_count =
         ((transient_rrb<int,_false,_6> *)local_18.ptr)->_ref_count + 1;
  }
  piVar1 = rrb_nth<int,false,6>(&local_18,index);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_18);
  return piVar1;
}

Assistant:

inline const T& transient_rrb_nth(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, uint32_t index)
    {
    using namespace rrb_details;
    check_transience(trrb);
    return rrb_nth((const ref<rrb<T, atomic_ref_counting, N>>&)trrb, index);
    }